

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_read_pcm_frames
                    (ma_decoder *pDecoder,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  int iVar1;
  ma_data_source *pDataSource;
  ulong uVar2;
  ma_uint64 mVar3;
  ma_result mVar4;
  ma_result mVar5;
  ulong uVar6;
  ulong frameCount_00;
  void *pFramesOut_00;
  ma_uint64 totalFramesReadOut;
  ma_uint64 framesToReadThisIterationOut;
  ma_uint32 internalChannels;
  ma_format internalFormat;
  ma_data_converter *local_1058;
  ma_uint32 local_104c;
  ma_uint64 framesReadThisIterationOut;
  ma_uint64 requiredInputFrameCount;
  ma_uint8 pIntermediaryBuffer [4096];
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  if (pDecoder == (ma_decoder *)0x0 || frameCount == 0) {
    return MA_INVALID_ARGS;
  }
  pDataSource = pDecoder->pBackend;
  if (pDataSource == (ma_data_source *)0x0) {
    return MA_INVALID_OPERATION;
  }
  if ((pDecoder->converter).isPassthrough == '\0') {
    if ((pFramesOut != (void *)0x0) || ((pDecoder->converter).hasResampler != '\0')) {
      totalFramesReadOut = 0;
      mVar4 = ma_data_source_get_data_format
                        (pDataSource,&internalFormat,&internalChannels,(ma_uint32 *)0x0,
                         (ma_channel *)0x0,0);
      if (mVar4 != MA_SUCCESS) {
        return mVar4;
      }
      local_1058 = &pDecoder->converter;
      if (pDecoder->pInputCache == (void *)0x0) {
        do {
          uVar6 = frameCount - totalFramesReadOut;
          if (frameCount < totalFramesReadOut || uVar6 == 0) break;
          local_104c = internalChannels;
          iVar1 = *(int *)(&DAT_00176420 + (ulong)internalFormat * 4);
          ma_data_converter_get_required_input_frame_count
                    (local_1058,uVar6,&requiredInputFrameCount);
          if (requiredInputFrameCount == 0) {
            framesToReadThisIterationOut = 0;
            pIntermediaryBuffer._0_8_ = pIntermediaryBuffer._0_8_ & 0xffffffffffffff00;
          }
          else {
            uVar2 = 0x1000 / (ulong)(iVar1 * local_104c);
            frameCount_00 = uVar6;
            if (uVar2 <= uVar6) {
              frameCount_00 = uVar2;
            }
            if (requiredInputFrameCount <= frameCount_00) {
              frameCount_00 = requiredInputFrameCount;
            }
            mVar4 = ma_data_source_read_pcm_frames
                              (pDecoder->pBackend,pIntermediaryBuffer,frameCount_00,
                               &framesToReadThisIterationOut);
            if ((mVar4 != MA_AT_END) && (mVar4 != MA_SUCCESS)) goto LAB_00150a4d;
          }
          framesReadThisIterationOut = uVar6;
          mVar4 = ma_data_converter_process_pcm_frames
                            (local_1058,pIntermediaryBuffer,&framesToReadThisIterationOut,pFramesOut
                             ,&framesReadThisIterationOut);
          if (mVar4 != MA_SUCCESS) goto LAB_00150a4d;
          totalFramesReadOut = totalFramesReadOut + framesReadThisIterationOut;
          if (pFramesOut == (void *)0x0) {
            pFramesOut = (void *)0x0;
          }
          else {
            pFramesOut = (void *)((long)pFramesOut +
                                 (*(int *)(&DAT_00176420 + (ulong)pDecoder->outputFormat * 4) *
                                 pDecoder->outputChannels) * framesReadThisIterationOut);
          }
        } while (framesReadThisIterationOut != 0 || framesToReadThisIterationOut != 0);
LAB_00150ced:
        mVar4 = MA_SUCCESS;
      }
      else {
LAB_00150ae2:
        do {
          uVar6 = frameCount - totalFramesReadOut;
          if (frameCount < totalFramesReadOut || uVar6 == 0) goto LAB_00150ced;
          pFramesOut_00 = pDecoder->pInputCache;
          uVar2 = pDecoder->inputCacheRemaining;
          if (uVar2 != 0) {
            pIntermediaryBuffer._0_8_ = uVar2;
            if (uVar6 < uVar2) {
              pIntermediaryBuffer._0_8_ = uVar6;
            }
            framesToReadThisIterationOut = uVar6;
            mVar4 = ma_data_converter_process_pcm_frames
                              (local_1058,
                               (void *)((long)pFramesOut_00 +
                                       (ulong)(*(int *)(&DAT_00176420 + (ulong)internalFormat * 4) *
                                              internalChannels) * pDecoder->inputCacheConsumed),
                               (ma_uint64 *)pIntermediaryBuffer,pFramesOut,
                               &framesToReadThisIterationOut);
            if (mVar4 != MA_SUCCESS) break;
            pDecoder->inputCacheConsumed = pDecoder->inputCacheConsumed + pIntermediaryBuffer._0_8_;
            mVar3 = pDecoder->inputCacheRemaining;
            pDecoder->inputCacheRemaining = mVar3 - pIntermediaryBuffer._0_8_;
            totalFramesReadOut = totalFramesReadOut + framesToReadThisIterationOut;
            if (pFramesOut == (void *)0x0) {
              pFramesOut = (void *)0x0;
            }
            else {
              pFramesOut = (void *)((long)pFramesOut +
                                   (*(int *)(&DAT_00176420 + (ulong)pDecoder->outputFormat * 4) *
                                   pDecoder->outputChannels) * framesToReadThisIterationOut);
            }
            if (framesToReadThisIterationOut == 0 && pIntermediaryBuffer._0_8_ == 0)
            goto LAB_00150ced;
            if (mVar3 != pIntermediaryBuffer._0_8_) goto LAB_00150ae2;
            pFramesOut_00 = pDecoder->pInputCache;
          }
          pDecoder->inputCacheConsumed = 0;
          mVar4 = ma_data_source_read_pcm_frames
                            (pDecoder->pBackend,pFramesOut_00,pDecoder->inputCacheCap,
                             &pDecoder->inputCacheRemaining);
        } while (mVar4 == MA_SUCCESS);
      }
      goto LAB_00150a4d;
    }
    pFramesOut = (void *)0x0;
  }
  mVar4 = ma_data_source_read_pcm_frames(pDataSource,pFramesOut,frameCount,&totalFramesReadOut);
LAB_00150a4d:
  pDecoder->readPointerInPCMFrames = pDecoder->readPointerInPCMFrames + totalFramesReadOut;
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = totalFramesReadOut;
  }
  mVar5 = MA_AT_END;
  if (totalFramesReadOut != 0) {
    mVar5 = mVar4;
  }
  if (mVar4 != MA_SUCCESS) {
    mVar5 = mVar4;
  }
  return mVar5;
}

Assistant:

MA_API ma_result ma_decoder_read_pcm_frames(ma_decoder* pDecoder, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 totalFramesReadOut;
    void* pRunningFramesOut;

    if (pFramesRead != NULL) {
        *pFramesRead = 0;   /* Safety. */
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend == NULL) {
        return MA_INVALID_OPERATION;
    }

    /* Fast path. */
    if (pDecoder->converter.isPassthrough) {
        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pFramesOut, frameCount, &totalFramesReadOut);
    } else {
        /*
        Getting here means we need to do data conversion. If we're seeking forward and are _not_ doing resampling we can run this in a fast path. If we're doing resampling we
        need to run through each sample because we need to ensure its internal cache is updated.
        */
        if (pFramesOut == NULL && pDecoder->converter.hasResampler == MA_FALSE) {
            result = ma_data_source_read_pcm_frames(pDecoder->pBackend, NULL, frameCount, &totalFramesReadOut);
        } else {
            /* Slow path. Need to run everything through the data converter. */
            ma_format internalFormat;
            ma_uint32 internalChannels;

            totalFramesReadOut = 0;
            pRunningFramesOut  = pFramesOut;

            result = ma_data_source_get_data_format(pDecoder->pBackend, &internalFormat, &internalChannels, NULL, NULL, 0);
            if (result != MA_SUCCESS) {
                return result;   /* Failed to retrieve the internal format and channel count. */
            }

            /*
            We run a different path depending on whether or not we are using a heap-allocated
            intermediary buffer or not. If the data converter does not support the calculation of
            the required number of input frames, we'll use the heap-allocated path. Otherwise we'll
            use the stack-allocated path.
            */
            if (pDecoder->pInputCache != NULL) {
                /* We don't have a way of determining the required number of input frames, so need to persistently store input data in a cache. */
                while (totalFramesReadOut < frameCount) {
                    ma_uint64 framesToReadThisIterationIn;
                    ma_uint64 framesToReadThisIterationOut;

                    /* If there's any data available in the cache, that needs to get processed first. */
                    if (pDecoder->inputCacheRemaining > 0) {
                        framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
                        framesToReadThisIterationIn  = framesToReadThisIterationOut;
                        if (framesToReadThisIterationIn > pDecoder->inputCacheRemaining) {
                            framesToReadThisIterationIn = pDecoder->inputCacheRemaining;
                        }

                        result = ma_data_converter_process_pcm_frames(&pDecoder->converter, ma_offset_pcm_frames_ptr(pDecoder->pInputCache, pDecoder->inputCacheConsumed, internalFormat, internalChannels), &framesToReadThisIterationIn, pRunningFramesOut, &framesToReadThisIterationOut);
                        if (result != MA_SUCCESS) {
                            break;
                        }

                        pDecoder->inputCacheConsumed  += framesToReadThisIterationIn;
                        pDecoder->inputCacheRemaining -= framesToReadThisIterationIn;

                        totalFramesReadOut += framesToReadThisIterationOut;

                        if (pRunningFramesOut != NULL) {
                            pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesToReadThisIterationOut * ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels));
                        }

                        if (framesToReadThisIterationIn == 0 && framesToReadThisIterationOut == 0) {
                            break;  /* We're done. */
                        }
                    }

                    /* Getting here means there's no data in the cache and we need to fill it up from the data source. */
                    if (pDecoder->inputCacheRemaining == 0) {
                        pDecoder->inputCacheConsumed = 0;

                        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pDecoder->pInputCache, pDecoder->inputCacheCap, &pDecoder->inputCacheRemaining);
                        if (result != MA_SUCCESS) {
                            break;
                        }
                    }
                }
            } else {
                /* We have a way of determining the required number of input frames so just use the stack. */
                while (totalFramesReadOut < frameCount) {
                    ma_uint8 pIntermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In internal format. */
                    ma_uint64 intermediaryBufferCap = sizeof(pIntermediaryBuffer) / ma_get_bytes_per_frame(internalFormat, internalChannels);
                    ma_uint64 framesToReadThisIterationIn;
                    ma_uint64 framesReadThisIterationIn;
                    ma_uint64 framesToReadThisIterationOut;
                    ma_uint64 framesReadThisIterationOut;
                    ma_uint64 requiredInputFrameCount;

                    framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
                    framesToReadThisIterationIn = framesToReadThisIterationOut;
                    if (framesToReadThisIterationIn > intermediaryBufferCap) {
                        framesToReadThisIterationIn = intermediaryBufferCap;
                    }

                    ma_data_converter_get_required_input_frame_count(&pDecoder->converter, framesToReadThisIterationOut, &requiredInputFrameCount);
                    if (framesToReadThisIterationIn > requiredInputFrameCount) {
                        framesToReadThisIterationIn = requiredInputFrameCount;
                    }

                    if (requiredInputFrameCount > 0) {
                        result = ma_data_source_read_pcm_frames(pDecoder->pBackend, pIntermediaryBuffer, framesToReadThisIterationIn, &framesReadThisIterationIn);

                        /*
                        Note here that even if we've reached the end, we don't want to abort because there might be more output frames needing to be
                        generated from cached input data, which might happen if resampling is being performed.
                        */
                        if (result != MA_SUCCESS && result != MA_AT_END) {
                            break;
                        }
                    } else {
                        framesReadThisIterationIn = 0;
                        pIntermediaryBuffer[0] = 0; /* <-- This is just to silence a static analysis warning. */
                    }

                    /*
                    At this point we have our decoded data in input format and now we need to convert to output format. Note that even if we didn't read any
                    input frames, we still want to try processing frames because there may some output frames generated from cached input data.
                    */
                    framesReadThisIterationOut = framesToReadThisIterationOut;
                    result = ma_data_converter_process_pcm_frames(&pDecoder->converter, pIntermediaryBuffer, &framesReadThisIterationIn, pRunningFramesOut, &framesReadThisIterationOut);
                    if (result != MA_SUCCESS) {
                        break;
                    }

                    totalFramesReadOut += framesReadThisIterationOut;

                    if (pRunningFramesOut != NULL) {
                        pRunningFramesOut = ma_offset_ptr(pRunningFramesOut, framesReadThisIterationOut * ma_get_bytes_per_frame(pDecoder->outputFormat, pDecoder->outputChannels));
                    }

                    if (framesReadThisIterationIn == 0 && framesReadThisIterationOut == 0) {
                        break;  /* We're done. */
                    }
                }
            }
        }
    }

    pDecoder->readPointerInPCMFrames += totalFramesReadOut;

    if (pFramesRead != NULL) {
        *pFramesRead = totalFramesReadOut;
    }

    if (result == MA_SUCCESS && totalFramesReadOut == 0) {
        result =  MA_AT_END;
    }

    return result;
}